

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O0

void __thiscall QWidgetPrivate::~QWidgetPrivate(QWidgetPrivate *this)

{
  bool bVar1;
  QWidgetPrivate *in_RDI;
  
  *(undefined ***)in_RDI = &PTR__QWidgetPrivate_00d08298;
  if (in_RDI->widgetItem != (QWidgetItemV2 *)0x0) {
    (in_RDI->widgetItem->super_QWidgetItem).wid = (QWidget *)0x0;
  }
  bVar1 = std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<QWExtra,_std::default_delete<QWExtra>_> *)0x35aaa1);
  if (bVar1) {
    deleteExtra(in_RDI);
  }
  QMap<Qt::GestureType,_QFlags<Qt::GestureFlag>_>::~QMap
            ((QMap<Qt::GestureType,_QFlags<Qt::GestureFlag>_> *)0x35aac2);
  QList<QAction_*>::~QList((QList<QAction_*> *)0x35aad3);
  QLocale::~QLocale(&in_RDI->locale);
  QWidgetData::~QWidgetData((QWidgetData *)in_RDI);
  QString::~QString((QString *)0x35ab06);
  QString::~QString((QString *)0x35ab17);
  QString::~QString((QString *)0x35ab28);
  QString::~QString((QString *)0x35ab39);
  QString::~QString((QString *)0x35ab4a);
  QString::~QString((QString *)0x35ab5b);
  QRegion::~QRegion(&in_RDI->dirty);
  QRegion::~QRegion(&in_RDI->opaqueChildren);
  std::unique_ptr<QWExtra,_std::default_delete<QWExtra>_>::~unique_ptr
            ((unique_ptr<QWExtra,_std::default_delete<QWExtra>_> *)in_RDI);
  QObjectPrivate::~QObjectPrivate(&in_RDI->super_QObjectPrivate);
  return;
}

Assistant:

QWidgetPrivate::~QWidgetPrivate()
{
    if (widgetItem)
        widgetItem->wid = nullptr;

    if (extra)
        deleteExtra();
}